

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

void * cab_read_ahead_remaining(archive_read *a,size_t min,ssize_t *avail)

{
  void *pvVar1;
  void *p;
  ssize_t *avail_local;
  size_t min_local;
  archive_read *a_local;
  
  avail_local = (ssize_t *)min;
  while( true ) {
    if (avail_local == (ssize_t *)0x0) {
      return (void *)0x0;
    }
    pvVar1 = __archive_read_ahead(a,(size_t)avail_local,avail);
    if (pvVar1 != (void *)0x0) break;
    avail_local = (ssize_t *)((long)avail_local + -1);
  }
  return pvVar1;
}

Assistant:

static const void *
cab_read_ahead_remaining(struct archive_read *a, size_t min, ssize_t *avail)
{
	const void *p;

	while (min > 0) {
		p = __archive_read_ahead(a, min, avail);
		if (p != NULL)
			return (p);
		min--;
	}
	return (NULL);
}